

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O1

dropt_stringstream * dropt_ssopen(void)

{
  dropt_stringstream *__ptr;
  dropt_char *pdVar1;
  
  __ptr = (dropt_stringstream *)malloc(0x18);
  if (__ptr != (dropt_stringstream *)0x0) {
    __ptr->used = 0;
    __ptr->maxSize = 0x100;
    pdVar1 = (dropt_char *)malloc(0x100);
    __ptr->string = pdVar1;
    if (pdVar1 != (dropt_char *)0x0) {
      *pdVar1 = '\0';
      return __ptr;
    }
    free(__ptr);
  }
  return (dropt_stringstream *)0x0;
}

Assistant:

dropt_stringstream*
dropt_ssopen(void)
{
    dropt_stringstream* ss = malloc(sizeof *ss);
    if (ss != NULL)
    {
        ss->used = 0;
        ss->maxSize = default_stringstream_buffer_size;
        ss->string = dropt_safe_malloc(ss->maxSize, sizeof *ss->string);
        if (ss->string == NULL)
        {
            free(ss);
            ss = NULL;
        }
        else
        {
            ss->string[0] = DROPT_TEXT_LITERAL('\0');
        }
    }
    return ss;
}